

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O0

void __thiscall Sinclair::ZX8081::Video::flush(Video *this,bool next_sync)

{
  int iVar1;
  IntType IVar2;
  int *piVar3;
  WrappedInt<HalfCycles> local_30;
  HalfCycles local_28;
  int local_20;
  int local_1c;
  int local_18;
  int output_length;
  int data_length;
  bool next_sync_local;
  Video *this_local;
  
  output_length._3_1_ = next_sync;
  _data_length = this;
  if ((this->sync_ & 1U) == 0) {
    if (this->line_data_ != (uint8_t *)0x0) {
      iVar1 = (int)this->line_data_pointer_ - (int)this->line_data_;
      local_18 = iVar1;
      IVar2 = WrappedInt<HalfCycles>::as_integral
                        (&(this->time_since_update_).super_WrappedInt<HalfCycles>);
      if (((int)IVar2 <= iVar1) && ((output_length._3_1_ & 1) == 0)) {
        return;
      }
      IVar2 = WrappedInt<HalfCycles>::as_integral
                        (&(this->time_since_update_).super_WrappedInt<HalfCycles>);
      local_20 = (int)IVar2;
      piVar3 = std::min<int>(&local_18,&local_20);
      local_1c = *piVar3;
      Outputs::CRT::CRT::output_data(&this->crt_,local_1c);
      this->line_data_ = (uint8_t *)0x0;
      this->line_data_pointer_ = (uint8_t *)0x0;
      HalfCycles::HalfCycles(&local_28,(long)local_1c);
      WrappedInt<HalfCycles>::operator-=
                (&(this->time_since_update_).super_WrappedInt<HalfCycles>,&local_28);
    }
    iVar1 = WrappedInt<HalfCycles>::as<int>
                      (&(this->time_since_update_).super_WrappedInt<HalfCycles>);
    Outputs::CRT::CRT::output_level<unsigned_char>(&this->crt_,iVar1,0xff);
  }
  else {
    IVar2 = WrappedInt<HalfCycles>::as_integral
                      (&(this->time_since_update_).super_WrappedInt<HalfCycles>);
    Outputs::CRT::CRT::output_sync(&this->crt_,(int)IVar2);
  }
  HalfCycles::HalfCycles((HalfCycles *)&local_30,0);
  (this->time_since_update_).super_WrappedInt<HalfCycles>.length_ = local_30.length_;
  return;
}

Assistant:

void Video::flush(bool next_sync) {
	if(sync_) {
		// If in sync, that takes priority. Output the proper amount of sync.
		crt_.output_sync(int(time_since_update_.as_integral()));
	} else {
		// If not presently in sync, then...

		if(line_data_) {
			// If there is output data queued, output it either if it's being interrupted by
			// sync, or if we're past its end anyway. Otherwise let it be.
			int data_length = int(line_data_pointer_ - line_data_);
			if(data_length < int(time_since_update_.as_integral()) || next_sync) {
				auto output_length = std::min(data_length, int(time_since_update_.as_integral()));
				crt_.output_data(output_length);
				line_data_pointer_ = line_data_ = nullptr;
				time_since_update_ -= HalfCycles(output_length);
			} else return;
		}

		// Any pending pixels being dealt with, pad with the white level.
		crt_.output_level<uint8_t>(time_since_update_.as<int>(), 0xff);
	}

	time_since_update_ = 0;
}